

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O2

Result __thiscall
PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
::Poll(PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
       *this)

{
  anon_enum_32 aVar1;
  
  putchar(10);
  aVar1 = SCoro::
          Poll<SCoro::SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,RecordTime,WaitForExpiry,PrintPollAttempts,RecordTime>,5ul,WaitForExpiry,RecordTime,Initial>>::PrintPlus,PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,RecordTime,WaitForExpiry,PrintPollAttempts,RecordTime>,5ul,WaitForExpiry,RecordTime,Initial>>::PrintNewline>>
                    (&this->nested_state);
  return (Result)((aVar1 == End) + Yield);
}

Assistant:

SCoro::Result Poll() noexcept
    {
        std::printf("\n");
        return !nested_state.Poll();
    }